

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connection.cpp
# Opt level: O1

void Am_Connection::Delete_Connection(Am_Connection *doomed_connection_ptr)

{
  Am_Connection *this;
  connection_list_class *pcVar1;
  Connection_List_Ptr pcVar2;
  Connection_List_Ptr pcVar3;
  
  pcVar3 = connection_list;
  if (connection_list != (Connection_List_Ptr)0x0) {
    if (connection_list->connection_ptr == doomed_connection_ptr) {
      connection_list = connection_list->next;
      operator_delete(pcVar3);
      return;
    }
    this = connection_list->connection_ptr;
    pcVar1 = connection_list;
    while (pcVar2 = pcVar1, this != doomed_connection_ptr) {
      pcVar1 = pcVar2->next;
      if (pcVar1 == (connection_list_class *)0x0) {
        return;
      }
      this = pcVar1->connection_ptr;
      pcVar3 = pcVar2;
    }
    pcVar3->next = pcVar2->next;
    if (this != (Am_Connection *)0x0) {
      ~Am_Connection(this);
      operator_delete(this);
    }
    operator_delete(pcVar2);
    num_sockets = num_sockets + -1;
  }
  return;
}

Assistant:

void
Am_Connection::Delete_Connection(Am_Connection *doomed_connection_ptr)
{
  Connection_List_Ptr place_holder, old_place_holder;
  old_place_holder = place_holder = connection_list;
  if (place_holder == nullptr) {
  } else {
    if (place_holder->connection_ptr == doomed_connection_ptr) {
      connection_list = place_holder->next;
      delete (place_holder);
    } else {
      while ((place_holder != nullptr) &&
             (place_holder->connection_ptr != doomed_connection_ptr)) {
        old_place_holder = place_holder;
        place_holder = place_holder->next;
      }
      if (place_holder != nullptr) {
        old_place_holder->next = place_holder->next;
        delete (place_holder->connection_ptr);
        delete (place_holder);
        num_sockets--;
      } else {
      }
    }
  }
}